

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O1

void __thiscall
amrex::EB2::Level::fillEdgeCent(Level *this,Array<MultiFab_*,_3> *a_edgecent,Geometry *geom)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  element_type *peVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ulong uVar13;
  pointer ppVar14;
  long lVar15;
  IndexType typ;
  long lVar16;
  int idim;
  long lVar17;
  FabArray<amrex::FArrayBox> *pFVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  FabArray<amrex::FArrayBox> *src;
  pointer pIVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  Periodicity PVar27;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  Box r;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_1b8;
  BoxArray *local_1a0;
  Array<MultiFab_*,_3> *local_198;
  Array<MultiFab,_3> *local_190;
  long local_188;
  FabArray<amrex::FArrayBox> *local_180;
  pointer local_178;
  pointer local_170;
  long local_168;
  long local_160;
  Array4<double> local_158;
  MFIter mfi;
  Box local_b4;
  BoxArray local_98;
  
  lVar17 = 0;
  do {
    pFVar18 = &a_edgecent->_M_elems[lVar17]->super_FabArray<amrex::FArrayBox>;
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (pFVar18,1.0,0,(pFVar18->super_FabArrayBase).n_comp,
               &(pFVar18->super_FabArrayBase).n_grow);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  if (this->m_allregular == false) {
    local_190 = &this->m_edgecent;
    local_1a0 = &this->m_covered_grids;
    local_188 = 0;
    local_198 = a_edgecent;
    do {
      pFVar18 = &local_198->_M_elems[local_188]->super_FabArray<amrex::FArrayBox>;
      src = &local_190->_M_elems[local_188].super_FabArray<amrex::FArrayBox>;
      iVar1 = (pFVar18->super_FabArrayBase).n_grow.vect[0];
      iVar2 = (pFVar18->super_FabArrayBase).n_comp;
      PVar27 = Geometry::periodicity(geom);
      local_158.p = PVar27.period.vect._0_8_;
      local_158.jstride._0_4_ = PVar27.period.vect[2];
      local_98.m_bat._0_12_ = ZEXT812(0);
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = iVar1;
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = iVar1;
      mfi.fabArray._0_4_ = iVar1;
      FabArray<amrex::FArrayBox>::ParallelCopy_nowait
                (pFVar18,src,0,0,iVar2,(IntVect *)&local_98,(IntVect *)&mfi,
                 (Periodicity *)&local_158,COPY,(CPC *)0x0,false);
      peVar9 = (this->m_covered_grids).m_ref.
               super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar9->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_start !=
          *(pointer *)
           ((long)&(peVar9->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data + 8)) {
        local_98.m_bat._0_12_ = Geometry::periodicity(geom);
        Periodicity::shiftIntVect(&local_1b8,(Periodicity *)&local_98);
        lVar17 = 0xc;
        typ.itype = 0;
        switch((pFVar18->super_FabArrayBase).boxarray.m_bat.m_bat_type) {
        default:
          lVar17 = 0x10;
        case indexType:
        case indexType_coarsenRatio:
          typ.itype = *(uint *)((long)&(pFVar18->super_FabArrayBase)._vptr_FabArrayBase + lVar17);
        case null:
        case coarsenRatio:
          convert(&local_98,local_1a0,typ);
          isects.
          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          isects.
          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          isects.
          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          MFIter::MFIter(&mfi,&pFVar18->super_FabArrayBase,'\0');
          local_180 = pFVar18;
          if (mfi.currentIndex < mfi.endIndex) {
            do {
              FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_158,pFVar18,&mfi);
              FabArrayBase::fabbox
                        (&local_b4,(FabArrayBase *)CONCAT44(mfi.fabArray._4_4_,(int)mfi.fabArray),
                         ((mfi.index_map)->super_vector<int,_std::allocator<int>_>).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[mfi.currentIndex]);
              local_178 = local_1b8.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              pIVar24 = local_1b8.
                        super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if (local_1b8.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  local_1b8.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                do {
                  r.smallend.vect[0] = local_b4.smallend.vect[0] + (int)*(undefined8 *)pIVar24->vect
                  ;
                  r.smallend.vect[1] =
                       local_b4.smallend.vect[1] +
                       (int)((ulong)*(undefined8 *)pIVar24->vect >> 0x20);
                  r.smallend.vect[2] = local_b4.smallend.vect[2] + pIVar24->vect[2];
                  r.bigend.vect[0] = local_b4.bigend.vect[0] + pIVar24->vect[0];
                  r.bigend.vect[1] = local_b4.bigend.vect[1] + pIVar24->vect[1];
                  r.bigend.vect[2] = local_b4.bigend.vect[2];
                  r.btype.itype = local_b4.btype.itype;
                  r.bigend.vect[2] = r.bigend.vect[2] + pIVar24->vect[2];
                  BoxArray::intersections(&local_98,&r,&isects);
                  auVar12 = _DAT_0077bb40;
                  auVar11 = _DAT_0077bb30;
                  local_170 = isects.
                              super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  if (isects.
                      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      isects.
                      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    iVar1 = pIVar24->vect[0];
                    iVar2 = pIVar24->vect[1];
                    iVar3 = pIVar24->vect[2];
                    ppVar14 = isects.
                              super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    do {
                      iVar23 = (ppVar14->second).smallend.vect[2];
                      iVar4 = (ppVar14->second).bigend.vect[2];
                      if (iVar23 <= iVar4) {
                        iVar5 = (ppVar14->second).bigend.vect[1];
                        iVar6 = (ppVar14->second).bigend.vect[0];
                        iVar19 = iVar6 - iVar1;
                        iVar7 = (ppVar14->second).smallend.vect[0];
                        iVar8 = (ppVar14->second).smallend.vect[1];
                        iVar21 = iVar7 - iVar1;
                        local_168 = (long)(iVar8 - iVar2);
                        if (iVar19 <= iVar21) {
                          iVar19 = iVar21;
                        }
                        lVar16 = (long)iVar19 - (long)iVar21;
                        auVar25._8_4_ = (int)lVar16;
                        auVar25._0_8_ = lVar16;
                        auVar25._12_4_ = (int)((ulong)lVar16 >> 0x20);
                        local_160 = (long)iVar21 * 8;
                        auVar25 = auVar25 ^ auVar12;
                        lVar17 = (long)(iVar23 - iVar3);
                        do {
                          if (iVar8 <= iVar5) {
                            lVar20 = CONCAT44(local_158.jstride._4_4_,(int)local_158.jstride) * 8;
                            lVar22 = (long)local_158.p +
                                     (local_168 - local_158.begin.y) * lVar20 +
                                     (lVar17 - local_158.begin.z) * local_158.kstride * 8 +
                                     (long)local_158.begin.x * -8 + local_160 + 8;
                            lVar15 = local_168;
                            do {
                              if (iVar7 <= iVar6) {
                                uVar13 = 0;
                                do {
                                  auVar26._8_4_ = (int)uVar13;
                                  auVar26._0_8_ = uVar13;
                                  auVar26._12_4_ = (int)(uVar13 >> 0x20);
                                  auVar26 = (auVar26 | auVar11) ^ auVar12;
                                  bVar10 = auVar25._0_4_ < auVar26._0_4_;
                                  iVar23 = auVar25._4_4_;
                                  iVar19 = auVar26._4_4_;
                                  if ((bool)(~(iVar23 < iVar19 || iVar19 == iVar23 && bVar10) & 1))
                                  {
                                    *(undefined8 *)(lVar22 + -8 + uVar13 * 8) = 0xbff0000000000000;
                                  }
                                  if (iVar23 >= iVar19 && (iVar19 != iVar23 || !bVar10)) {
                                    *(undefined8 *)(lVar22 + uVar13 * 8) = 0xbff0000000000000;
                                  }
                                  uVar13 = uVar13 + 2;
                                } while ((lVar16 + 2U & 0xfffffffffffffffe) != uVar13);
                              }
                              lVar22 = lVar22 + lVar20;
                              bVar10 = lVar15 < iVar5 - iVar2;
                              lVar15 = lVar15 + 1;
                            } while (bVar10);
                          }
                          iVar23 = (int)lVar17;
                          lVar17 = lVar17 + 1;
                        } while (iVar23 < iVar4 - iVar3);
                      }
                      ppVar14 = ppVar14 + 1;
                    } while (ppVar14 !=
                             isects.
                             super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
                  }
                  pIVar24 = pIVar24 + 1;
                  pFVar18 = local_180;
                } while (pIVar24 != local_178);
              }
              MFIter::operator++(&mfi);
            } while (mfi.currentIndex < mfi.endIndex);
          }
          MFIter::~MFIter(&mfi);
          if (isects.
              super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(isects.
                            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)isects.
                                  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)isects.
                                  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          BoxArray::~BoxArray(&local_98);
          if (local_1b8.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1b8.
                            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_1b8.
                                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1b8.
                                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
      }
      local_188 = local_188 + 1;
    } while (local_188 != 3);
  }
  return;
}

Assistant:

void
Level::fillEdgeCent (Array<MultiFab*,AMREX_SPACEDIM> const& a_edgecent, const Geometry& geom) const
{
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        a_edgecent[idim]->setVal(1.0);
    }
    if (!isAllRegular()) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
        {
            auto& edgecent = *a_edgecent[idim];
            a_edgecent[idim]->ParallelCopy(m_edgecent[idim],0,0,edgecent.nComp(),
                                           0,edgecent.nGrow(),geom.periodicity());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            if (!m_covered_grids.empty())
            {
                const std::vector<IntVect>& pshifts = geom.periodicity().shiftIntVect();
                BoxArray const& covered_edge_grids = amrex::convert(m_covered_grids,
                                                                    edgecent.ixType());
                std::vector<std::pair<int,Box> > isects;
                for (MFIter mfi(edgecent); mfi.isValid(); ++mfi)
                {
                    auto const& fab = edgecent.array(mfi);
                    const Box& bx = mfi.fabbox();
                    for (const auto& iv : pshifts)
                    {
                        covered_edge_grids.intersections(bx+iv, isects);
                        for (const auto& is : isects) {
                            Box const& ibox = is.second-iv;
                            AMREX_HOST_DEVICE_PARALLEL_FOR_3D(ibox, i, j, k,
                            {
                                fab(i,j,k) = Real(-1.0);  // covered edges
                            });
                        }
                    }
                }
            }
        }
    }
}